

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2dd07fe::looksLikeSpecialVariable
          (anon_unknown_dwarf_2dd07fe *this,string *var,static_string_view prefix,size_t varNameLen)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined1 *local_88;
  undefined1 local_80 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  pcVar5 = prefix.super_string_view._M_str;
  pcVar1 = (char *)((long)&(var->_M_dataplus)._M_p + 3);
  if (pcVar1 <= pcVar5) {
    pcVar2 = *(char **)this;
    sVar3 = *(size_t *)(this + 8);
    local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = local_80;
    local_98._M_len = 0;
    local_98._M_str = &DAT_00000001;
    local_80[0] = 0x7b;
    local_48 = 1;
    local_38 = 0;
    views._M_len = 2;
    views._M_array = &local_60;
    local_60.first._M_len = (size_t)var;
    local_60.first._M_str = (char *)prefix.super_string_view._M_len;
    local_40 = local_88;
    cmCatViews(&local_b8,views);
    __str._M_str = local_b8._M_dataplus._M_p;
    __str._M_len = local_b8._M_string_length;
    local_98._M_len = sVar3;
    local_98._M_str = pcVar2;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_98,0,local_b8._M_string_length,__str);
    if (iVar4 == 0) {
      bVar6 = pcVar5[*(long *)this + -1] == '}';
      goto LAB_006989b7;
    }
  }
  bVar6 = false;
LAB_006989b7:
  if ((pcVar1 <= pcVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool looksLikeSpecialVariable(const std::string& var,
                              cm::static_string_view prefix,
                              const std::size_t varNameLen)
{
  // NOTE Expecting a variable name at least 1 char length:
  // <prefix> + `{` + <varname> + `}`
  return ((prefix.size() + 3) <= varNameLen) &&
    cmHasPrefix(var, cmStrCat(prefix, '{')) && var[varNameLen - 1] == '}';
}